

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void HE4_C(uint8_t *dst)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint8_t *in_RDI;
  int E;
  int D;
  int C;
  int B;
  int A;
  
  bVar1 = in_RDI[-1];
  uVar2 = (uint)in_RDI[0x1f];
  uVar3 = (uint)in_RDI[0x3f];
  uVar4 = (uint)in_RDI[0x5f];
  WebPUint32ToMem(in_RDI,((int)((uint)in_RDI[-0x21] + (uint)bVar1 * 2 + uVar2 + 2) >> 2 & 0xffU) *
                         0x1010101);
  WebPUint32ToMem(in_RDI + 0x20,
                  ((int)((uint)bVar1 + uVar2 * 2 + uVar3 + 2) >> 2 & 0xffU) * 0x1010101);
  WebPUint32ToMem(in_RDI + 0x40,((int)(uVar2 + uVar3 * 2 + uVar4 + 2) >> 2 & 0xffU) * 0x1010101);
  WebPUint32ToMem(in_RDI + 0x60,((int)(uVar3 + uVar4 * 2 + uVar4 + 2) >> 2 & 0xffU) * 0x1010101);
  return;
}

Assistant:

static void HE4_C(uint8_t* dst) {    // horizontal
  const int A = dst[-1 - BPS];
  const int B = dst[-1];
  const int C = dst[-1 + BPS];
  const int D = dst[-1 + 2 * BPS];
  const int E = dst[-1 + 3 * BPS];
  WebPUint32ToMem(dst + 0 * BPS, 0x01010101U * AVG3(A, B, C));
  WebPUint32ToMem(dst + 1 * BPS, 0x01010101U * AVG3(B, C, D));
  WebPUint32ToMem(dst + 2 * BPS, 0x01010101U * AVG3(C, D, E));
  WebPUint32ToMem(dst + 3 * BPS, 0x01010101U * AVG3(D, E, E));
}